

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  PClass *pPVar4;
  byte bVar5;
  int iVar6;
  undefined4 extraout_var;
  AActor *pAVar8;
  AInventory *pAVar9;
  PClassActor *pPVar10;
  uint uVar11;
  PClassActor *type;
  char *pcVar12;
  bool bVar13;
  DVector3 local_48;
  PClass *pPVar7;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003d176f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d1756:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d176f:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar8 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar8 == (AActor *)0x0) goto LAB_003d135f;
    pPVar7 = (pAVar8->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar6 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
      (pAVar8->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar13 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d176f;
    }
  }
  else {
    if (pAVar8 != (AActor *)0x0) goto LAB_003d1756;
LAB_003d135f:
    pAVar8 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003d178e;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d175f:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d178e:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b4,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003d13c0;
    pPVar10 = type;
    if (type != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
        if (pPVar10 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar10 != (PClassActor *)0x0);
      if (pPVar10 == (PClassActor *)0x0) {
        pcVar12 = "itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))";
        goto LAB_003d178e;
      }
    }
    bVar13 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003d175f;
LAB_003d13c0:
    bVar13 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    pcVar12 = "(paramnum) < numparam";
LAB_003d17b6:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b5,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar12 = "param[paramnum].Type == REGT_INT";
    goto LAB_003d17b6;
  }
  uVar11 = param[2].field_0.i;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d17fd:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b6,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[3].field_0.i;
LAB_003d1422:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d17d5:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b7,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar12 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d17fd;
    }
    iVar6 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003d1422;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar12 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d17d5;
    }
  }
  if (bVar13) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9bd,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    iVar2 = param[4].field_0.i;
    pAVar8 = COPY_AAPTR(pAVar8,iVar6);
    if (pAVar8 == (AActor *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9c4,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      pAVar9 = AActor::FindInventory(pAVar8,type,false);
      if (pAVar9 == (AInventory *)0x0) {
        if ((int)uVar11 < 1) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x9e9,
                          "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          local_48.X = 0.0;
          local_48.Y = 0.0;
          local_48.Z = 0.0;
          pAVar9 = (AInventory *)AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
          if (pAVar9 == (AInventory *)0x0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9ee,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            pAVar9->Amount = uVar11;
            pbVar1 = (byte *)((long)&(pAVar9->super_AActor).flags.Value + 2);
            *pbVar1 = *pbVar1 | 2;
            pbVar1 = (byte *)((long)&pAVar9->ItemFlags + 1);
            *pbVar1 = *pbVar1 | 0x40;
            AActor::ClearCounters((AActor *)pAVar9);
            bVar13 = AInventory::CallTryPickup(pAVar9,pAVar8,(AActor **)0x0);
            if (bVar13) {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x9fb,
                              "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              goto LAB_003d16a8;
            }
            (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9f9,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
        }
      }
      else {
        uVar3 = pAVar9->Amount;
        if (uVar3 != uVar11) {
          if ((int)uVar11 < 1) {
            iVar6 = (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar8,type,(ulong)uVar3,1,0);
            bVar5 = (byte)iVar6;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9d7,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else if (uVar3 - uVar11 == 0 || (int)uVar3 < (int)uVar11) {
            if ((iVar2 == 0) && (pAVar9->MaxAmount <= (int)uVar11)) {
              uVar11 = pAVar9->MaxAmount;
            }
            pAVar9->Amount = uVar11;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9e2,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
LAB_003d16a8:
            bVar5 = 1;
          }
          else {
            iVar6 = (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar8,type,(ulong)(uVar3 - uVar11),1,0);
            bVar5 = (byte)iVar6;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9dd,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (ret->RegType != '\0') goto LAB_003d16b4;
          goto LAB_003d14f3;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x9d1,
                        "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
  }
  if (ret->RegType != '\0') {
LAB_003d16b4:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  bVar5 = 0;
LAB_003d14f3:
  *(uint *)ret->Location = (uint)bVar5;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(itemtype, AInventory);
	PARAM_INT(amount);
	PARAM_INT_DEF(ptr);
	PARAM_BOOL_DEF(beyondMax);

	bool res = false;

	if (itemtype == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AInventory *item = mobj->FindInventory(itemtype);

	if (item != nullptr)
	{
		// A_SetInventory sets the absolute amount. 
		// Subtract or set the appropriate amount as necessary.

		if (amount == item->Amount)
		{
			// Nothing was changed.
			ACTION_RETURN_BOOL(false);
		}
		else if (amount <= 0)
		{
			//Remove it all.
			res = (mobj->TakeInventory(itemtype, item->Amount, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else if (amount < item->Amount)
		{
			int amt = abs(item->Amount - amount);
			res = (mobj->TakeInventory(itemtype, amt, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else
		{
			item->Amount = (beyondMax ? amount : clamp(amount, 0, item->MaxAmount));
			ACTION_RETURN_BOOL(true);
		}
	}
	else
	{
		if (amount <= 0)
		{
			ACTION_RETURN_BOOL(false);
		}
		item = static_cast<AInventory *>(Spawn(itemtype));
		if (item == nullptr)
		{
			ACTION_RETURN_BOOL(false);
		}
		else
		{
			item->Amount = amount;
			item->flags |= MF_DROPPED;
			item->ItemFlags |= IF_IGNORESKILL;
			item->ClearCounters();
			if (!item->CallTryPickup(mobj))
			{
				item->Destroy();
				ACTION_RETURN_BOOL(false);
			}
			ACTION_RETURN_BOOL(true);
		}
	}
	ACTION_RETURN_BOOL(false);
}